

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O3

void __thiscall json::Value::unescapeIntoWTF16(Value *this,char *str)

{
  undefined1 in_CL;
  long *__ptr;
  string_view sVar1;
  stringstream local_1c8 [8];
  stringstream ss;
  ostream local_1b8 [112];
  ios_base local_148 [264];
  long *local_40;
  IString *local_38;
  long local_30 [2];
  
  std::__cxx11::stringstream::stringstream(local_1c8);
  ::wasm::String::unescapeUTF8JSONtoWTF16(local_1b8,str);
  std::__cxx11::stringbuf::str();
  sVar1._M_str = (char *)0x0;
  sVar1._M_len = (size_t)local_40;
  __ptr = local_40;
  sVar1 = ::wasm::IString::interned(local_38,sVar1,(bool)in_CL);
  free(this,__ptr);
  this->type = String;
  (this->field_1).str.str = sVar1;
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1c8);
  std::ios_base::~ios_base(local_148);
  return;
}

Assistant:

void unescapeIntoWTF16(char* str) {
    // TODO: Optimize the unescaped path? But it is impossible to avoid an
    //       allocation here.
    std::stringstream ss;
    wasm::String::unescapeUTF8JSONtoWTF16(ss, str);
    // TODO: Use ss.view() once we have C++20.
    setString(ss.str());
  }